

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O2

int zlib_run(zlib *zlib)

{
  png_uint_32 *ppVar1;
  uint uVar2;
  uint uVar3;
  IDAT *pIVar4;
  IDAT_list *pIVar5;
  chunk *pcVar6;
  int iVar7;
  IDAT_list *pIVar8;
  ulong uVar9;
  png_uint_32 pVar10;
  ulong uVar11;
  long lVar12;
  IDAT_list *pIVar13;
  
  zlib->extra_bytes = 0;
  pIVar4 = zlib->idat;
  uVar2 = zlib->rewrite_offset;
  if (pIVar4 == (IDAT *)0x0) {
    pcVar6 = zlib->chunk;
    uVar3 = pcVar6->chunk_length;
    pVar10 = uVar3 - uVar2;
    if (uVar2 <= uVar3 && pVar10 != 0) {
      iVar7 = zlib_advance(zlib,pVar10);
      ppVar1 = &pcVar6->chunk_length;
      *ppVar1 = *ppVar1 - zlib->extra_bytes;
      return iVar7;
    }
    __assert_fail("zlib->rewrite_offset < chunk->chunk_length",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                  ,0xa16,"int zlib_run(struct zlib *)");
  }
  if (uVar2 != 0) {
    __assert_fail("zlib->rewrite_offset == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                  ,0x9c4,"int zlib_run(struct zlib *)");
  }
  pIVar5 = pIVar4->idat_list_tail;
  pIVar13 = (IDAT_list *)&pIVar4->idat_list_head;
  iVar7 = 0;
  do {
    pIVar13 = pIVar13->next;
    uVar9 = (ulong)pIVar13->count;
    lVar12 = 0x100000000;
    for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      if (iVar7 != 0) {
        skip_12(zlib->file);
      }
      iVar7 = zlib_advance(zlib,pIVar13->lengths[uVar11]);
      if (iVar7 != 0) {
        if (iVar7 != 1) {
          return iVar7;
        }
        pVar10 = zlib->extra_bytes;
        if ((pVar10 == 0 & *(byte *)zlib->global) != 1) goto LAB_00105347;
        lVar12 = lVar12 >> 0x20;
        pIVar8 = pIVar13;
        goto LAB_001052ea;
      }
      lVar12 = lVar12 + 0x100000000;
      iVar7 = 0xc;
    }
    if (pIVar13 == pIVar5) {
      return 0;
    }
  } while( true );
LAB_001052ea:
  while (lVar12 < (int)uVar9) {
    ppVar1 = pIVar8->lengths + lVar12;
    lVar12 = lVar12 + 1;
    if (*ppVar1 != 0) {
      chunk_message(zlib->chunk,"extra compressed data");
      pVar10 = zlib->extra_bytes;
      goto LAB_00105347;
    }
  }
  if (pIVar8 == pIVar5) {
    pVar10 = 0;
LAB_00105347:
    pIVar13->lengths[uVar11] = pIVar13->lengths[uVar11] - pVar10;
    pIVar13->count = (int)uVar11 + 1;
    zlib->idat->idat_list_tail = pIVar13;
    return 1;
  }
  pIVar8 = pIVar8->next;
  uVar9 = (ulong)pIVar8->count;
  lVar12 = 0;
  goto LAB_001052ea;
}

Assistant:

static int
zlib_run(struct zlib *zlib)
   /* Like zlib_advance but also handles a stream of IDAT chunks. */
{
   /* The 'extra_bytes' field is set by zlib_advance if there is extra
    * compressed data in the chunk it handles (if it sees Z_STREAM_END before
    * all the input data has been used.)  This function uses the value to update
    * the correct chunk length, so the problem should only ever be detected once
    * for each chunk.  zlib_advance outputs the error message, though see the
    * IDAT specific check below.
    */
   zlib->extra_bytes = 0;

   if (zlib->idat != NULL)
   {
      struct IDAT_list *list = zlib->idat->idat_list_head;
      struct IDAT_list *last = zlib->idat->idat_list_tail;
      int        skip = 0;

      /* 'rewrite_offset' is the offset of the LZ data within the chunk, for
       * IDAT it should be 0:
       */
      assert(zlib->rewrite_offset == 0);

      /* Process each IDAT_list in turn; the caller has left the stream
       * positioned at the start of the first IDAT chunk data.
       */
      for (;;)
      {
         unsigned int count = list->count;
         unsigned int i;

         for (i = 0; i<count; ++i)
         {
            int rc;

            if (skip > 0) /* Skip CRC and next IDAT header */
               skip_12(zlib->file);

            skip = 12; /* for the next time */

            rc = zlib_advance(zlib, list->lengths[i]);

            switch (rc)
            {
               case ZLIB_OK: /* keep going */
                  break;

               case ZLIB_STREAM_END: /* stop */
                  /* There may be extra chunks; if there are and one of them is
                   * not zero length output the 'extra data' message.  Only do
                   * this check if errors are being output.
                   */
                  if (zlib->global->errors && zlib->extra_bytes == 0)
                  {
                     struct IDAT_list *check = list;
                     int j = i+1, jcount = count;

                     for (;;)
                     {
                        for (; j<jcount; ++j)
                           if (check->lengths[j] > 0)
                           {
                              chunk_message(zlib->chunk,
                                 "extra compressed data");
                              goto end_check;
                           }

                        if (check == last)
                           break;

                        check = check->next;
                        jcount = check->count;
                        j = 0;
                     }
                  }

               end_check:
                  /* Terminate the list at the current position, reducing the
                   * length of the last IDAT too if required.
                   */
                  list->lengths[i] -= zlib->extra_bytes;
                  list->count = i+1;
                  zlib->idat->idat_list_tail = list;
                  /* FALLTHROUGH */

               default:
                  return rc;
            }
         }

         /* At the end of the compressed data and Z_STREAM_END was not seen. */
         if (list == last)
            return ZLIB_OK;

         list = list->next;
      }
   }

   else
   {
      struct chunk *chunk = zlib->chunk;
      int rc;

      assert(zlib->rewrite_offset < chunk->chunk_length);

      rc = zlib_advance(zlib, chunk->chunk_length - zlib->rewrite_offset);

      /* The extra bytes in the chunk are handled now by adjusting the chunk
       * length to exclude them; the zlib data is always stored at the end of
       * the PNG chunk (although clearly this is not necessary.)  zlib_advance
       * has already output a warning message.
       */
      chunk->chunk_length -= zlib->extra_bytes;
      return rc;
   }
}